

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setScientificNotation(DecimalFormat *this,UBool useScientific)

{
  DecimalFormatProperties *pDVar1;
  uint uVar2;
  
  uVar2 = -(uint)(useScientific == '\0') | 1;
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->minimumExponentDigits == uVar2) {
    return;
  }
  pDVar1->minimumExponentDigits = uVar2;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setScientificNotation(UBool useScientific) {
    int32_t minExp = useScientific ? 1 : -1;
    if (fields->properties->minimumExponentDigits == minExp) { return; }
    if (useScientific) {
        fields->properties->minimumExponentDigits = 1;
    } else {
        fields->properties->minimumExponentDigits = -1;
    }
    touchNoError();
}